

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O1

StringRef llvm::DWARFUnitIndex::getColumnHeader(DWARFSectionKind DS)

{
  uint uVar1;
  StringRef SVar2;
  
  uVar1 = DS - DW_SECT_INFO;
  if (uVar1 < 8) {
    SVar2.Data = &DAT_00e7fc98 + *(int *)(&DAT_00e7fc98 + (ulong)uVar1 * 4);
    SVar2.Length = *(size_t *)(&DAT_00e7fc58 + (ulong)uVar1 * 8);
    return SVar2;
  }
  llvm_unreachable_internal
            ("unknown DWARFSectionKind",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnitIndex.cpp"
             ,0x79);
}

Assistant:

StringRef DWARFUnitIndex::getColumnHeader(DWARFSectionKind DS) {
#define CASE(DS)                                                               \
  case DW_SECT_##DS:                                                           \
    return #DS;
  switch (DS) {
    CASE(INFO);
    CASE(TYPES);
    CASE(ABBREV);
    CASE(LINE);
    CASE(LOC);
    CASE(STR_OFFSETS);
    CASE(MACINFO);
    CASE(MACRO);
  }
  llvm_unreachable("unknown DWARFSectionKind");
}